

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
::rebalance_or_split
          (btree<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           *this,iterator *iter)

{
  size_type sVar1;
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar2;
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  bVar3;
  uint uVar4;
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar5;
  ulong uVar6;
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar7;
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar8;
  ulong uVar9;
  int iVar10;
  allocator_type *alloc;
  char *__function;
  byte bVar11;
  long lVar12;
  int i;
  size_type sVar13;
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  bVar14;
  uint uVar15;
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  bVar16;
  size_type sVar17;
  allocator_type *in_R9;
  bool bVar18;
  iterator parent_iter;
  iterator local_40;
  
  pbVar8 = iter->node;
  if (((ulong)pbVar8 & 7) != 0) goto LAB_001d164d;
  bVar3 = pbVar8[0xb];
  alloc = (allocator_type *)(ulong)(byte)bVar3;
  bVar16 = (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            )0x1e;
  if (bVar3 != (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                )0x0) {
    bVar16 = bVar3;
  }
  if (pbVar8[10] != bVar16) {
    __assert_fail("node->count() == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb53,
                  "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  if (pbVar8[10] !=
      (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
       )0x1e) {
    __assert_fail("kNodeValues == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb54,
                  "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  pbVar7 = *(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
             **)pbVar8;
  if (pbVar8 == (this->root_).
                super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                ._M_head_impl) {
    pbVar7 = new_internal_node(this,pbVar7);
    btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
    ::init_child(pbVar7,0,(this->root_).
                          super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                          .
                          super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                          .
                          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                          .
                          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                          ._M_head_impl);
    (this->root_).
    super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
    ._M_head_impl = pbVar7;
    pbVar8 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
             ::child(pbVar7,0);
    if (((ulong)pbVar8 & 7) != 0) goto LAB_001d164d;
    if ((pbVar8[0xb] !=
         (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          )0x0) &&
       (pbVar8 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 ::child(pbVar7,0), pbVar8 != this->rightmost_)) {
      __assert_fail("!parent->child(0)->leaf() || parent->child(0) == rightmost_",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xba0,
                    "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                   );
    }
    goto LAB_001d12e3;
  }
  if ((ulong)(byte)pbVar8[8] == 0) goto LAB_001d11fd;
  pbVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::child(pbVar7,(ulong)(byte)pbVar8[8] - 1);
  if (((ulong)pbVar5 & 7) != 0) goto LAB_001d164d;
  if ((pbVar5[0xb] !=
       (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        )0x0) &&
     (pbVar5[0xb] !=
      (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
       )0x1e)) {
    __assert_fail("left->max_count() == kNodeValues",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb5c,
                  "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  bVar3 = pbVar5[10];
  uVar6 = (ulong)(byte)bVar3;
  if (uVar6 < 0x1e) {
    bVar11 = (byte)(0x1eU - (char)bVar3) >> (iter->position < 0x1e);
    sVar17 = 1;
    if (1 < bVar11) {
      sVar17 = (size_type)bVar11;
    }
    bVar16 = SUB81(sVar17,0);
    pbVar8 = iter->node;
    iVar10 = (int)sVar17;
    if ((iter->position < iVar10) &&
       (alloc = (allocator_type *)(ulong)(iVar10 + (uint)(byte)bVar3),
       0x1d < (byte)(iVar10 + (uint)(byte)bVar3))) goto LAB_001d11fd;
    if (((ulong)pbVar8 & 7) == 0) {
      uVar9 = *(ulong *)pbVar5;
      if (uVar9 != *(ulong *)pbVar8) {
        __assert_fail("parent() == right->parent()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x87f,
                      "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      if ((byte)pbVar5[8] + 1 != (uint)(byte)pbVar8[8]) {
        __assert_fail("position() + 1 == right->position()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x880,
                      "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      if ((byte)pbVar8[10] < (byte)bVar3) {
        __assert_fail("right->count() >= count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x881,
                      "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      if ((byte)pbVar8[10] < (byte)bVar16) {
        __assert_fail("to_move <= right->count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x883,
                      "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      if ((uVar9 & 7) == 0) {
        *(undefined8 *)(pbVar5 + uVar6 * 8 + 0xc) =
             *(undefined8 *)(uVar9 + 0xc + (ulong)(byte)pbVar5[8] * 8);
        uVar9 = (ulong)(iVar10 - 1);
        btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        ::uninitialized_move_n(pbVar8,uVar9,0,uVar6 + 1,pbVar5,in_R9);
        uVar6 = *(ulong *)pbVar5;
        if ((uVar6 & 7) == 0) {
          bVar3 = pbVar5[8];
          *(undefined4 *)(uVar6 + 0xc + (ulong)(byte)bVar3 * 8) =
               *(undefined4 *)(pbVar8 + uVar9 * 8 + 0xc);
          *(undefined4 *)(uVar6 + 0x10 + (ulong)(byte)bVar3 * 8) =
               *(undefined4 *)(pbVar8 + uVar9 * 8 + 0x10);
          bVar3 = pbVar8[10];
          if (bVar16 != bVar3) {
            pbVar7 = pbVar8 + 0xc;
            do {
              pbVar2 = pbVar7 + (uint)(iVar10 * 8);
              *(undefined4 *)pbVar7 = *(undefined4 *)pbVar2;
              *(undefined4 *)(pbVar7 + 4) = *(undefined4 *)(pbVar2 + 4);
              pbVar7 = pbVar7 + 8;
            } while (pbVar2 + 8 != pbVar8 + (ulong)(byte)bVar3 * 8 + 0xc);
          }
          if (pbVar5[0xb] ==
              (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               )0x0) {
            sVar13 = 0;
            do {
              bVar3 = pbVar5[10];
              sVar1 = sVar13 + 1;
              pbVar7 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                       ::child(pbVar8,sVar13);
              btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::init_child(pbVar5,(int)sVar13 + (uint)(byte)bVar3 + 1,pbVar7);
              sVar13 = sVar1;
            } while (sVar17 != sVar1);
            if ((byte)bVar16 <= (byte)pbVar8[10]) {
              lVar12 = 0;
              do {
                sVar13 = sVar17 + lVar12;
                bVar3 = pbVar8[0xb];
                if (pbVar8[0xb] ==
                    (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                     )0x0) {
                  bVar3 = (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                           )0x1e;
                }
                if ((int)(uint)(byte)bVar3 < (int)sVar13) {
                  __assert_fail("i + to_move <= right->max_count()",
                                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                ,0x89c,
                                "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                               );
                }
                pbVar7 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                         ::child(pbVar8,sVar13);
                btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::init_child(pbVar8,(int)lVar12,pbVar7);
                btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::mutable_child(pbVar8,sVar13);
                bVar18 = lVar12 < (long)((byte)pbVar8[10] - sVar17);
                lVar12 = lVar12 + 1;
              } while (bVar18);
            }
          }
          pbVar5[10] = (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                        )((char)pbVar5[10] + (char)bVar16);
          pbVar8[10] = (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                        )((char)pbVar8[10] - (char)bVar16);
          pbVar8 = iter->node;
          if (((ulong)pbVar8 & 7) == 0) {
            bVar3 = (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                     )0x1e;
            if (pbVar8[0xb] !=
                (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 )0x0) {
              bVar3 = pbVar8[0xb];
            }
            if ((uint)(byte)bVar3 - (uint)(byte)pbVar8[10] == iVar10) {
              iVar10 = iter->position - iVar10;
              iter->position = iVar10;
              if (iVar10 < 0) {
                iter->position = (uint)(byte)pbVar5[10] + iVar10 + 1;
                iter->node = pbVar5;
                pbVar8 = pbVar5;
              }
              bVar3 = (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                       )0x1e;
              if (pbVar8[0xb] !=
                  (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                   )0x0) {
                bVar3 = pbVar8[0xb];
              }
              if ((byte)pbVar8[10] < (byte)bVar3) {
                return;
              }
              __assert_fail("node->count() < node->max_count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xb70,
                            "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                           );
            }
            __assert_fail("node->max_count() - node->count() == to_move",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb69,
                          "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                         );
          }
          goto LAB_001d164d;
        }
      }
      goto LAB_001d16fa;
    }
LAB_001d16e0:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
  else {
    pbVar8 = iter->node;
LAB_001d11fd:
    if ((((ulong)pbVar8 & 7) == 0) && (((ulong)pbVar7 & 7) == 0)) {
      if ((byte)pbVar8[8] < (byte)pbVar7[10]) {
        pbVar8 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 ::child(pbVar7,(ulong)(byte)pbVar8[8] + 1);
        if (((ulong)pbVar8 & 7) != 0) goto LAB_001d164d;
        if ((pbVar8[0xb] !=
             (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              )0x0) &&
           (pbVar8[0xb] !=
            (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
             )0x1e)) {
          __assert_fail("right->max_count() == kNodeValues",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xb79,
                        "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                       );
        }
        bVar3 = pbVar8[10];
        if ((byte)bVar3 < 0x1e) {
          bVar11 = (byte)(0x1eU - (char)bVar3) >> (0 < iter->position);
          uVar15 = 1;
          if (1 < bVar11) {
            uVar15 = (uint)bVar11;
          }
          pbVar5 = iter->node;
          if (((ulong)pbVar5 & 7) != 0) goto LAB_001d164d;
          bVar16 = pbVar5[10];
          alloc = (allocator_type *)(ulong)(byte)bVar16;
          if ((iter->position <= (int)((byte)bVar16 - uVar15)) || (uVar15 + (byte)bVar3 < 0x1e)) {
            if (*(long *)pbVar5 != *(long *)pbVar8) {
              __assert_fail("parent() == right->parent()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ab,
                            "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                           );
            }
            if ((byte)pbVar5[8] + 1 != (uint)(byte)pbVar8[8]) {
              __assert_fail("position() + 1 == right->position()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ac,
                            "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                           );
            }
            if ((byte)bVar16 < (byte)bVar3) {
              __assert_fail("count() >= right->count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ad,
                            "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                           );
            }
            bVar14 = SUB41(uVar15,0);
            if ((byte)bVar16 < (byte)bVar14) {
              __assert_fail("to_move <= count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8af,
                            "void phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                           );
            }
            uVar6 = (ulong)uVar15;
            if ((byte)bVar3 < (byte)bVar14) {
              btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::uninitialized_move_n(pbVar8,(ulong)(byte)bVar3,0,uVar6,pbVar8,in_R9);
              if ((*(ulong *)pbVar5 & 7) == 0) {
                *(undefined8 *)(pbVar8 + uVar6 * 8 + 4) =
                     *(undefined8 *)(*(ulong *)pbVar5 + 0xc + (ulong)(byte)pbVar5[8] * 8);
                sVar17 = (size_type)(int)(~(uint)(byte)pbVar8[10] + uVar15);
                btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::uninitialized_move_n
                          (pbVar5,sVar17,(byte)pbVar5[10] - sVar17,(ulong)(byte)pbVar8[10],pbVar8,
                           in_R9);
                if (sVar17 != uVar6 - 1) {
                  bVar3 = pbVar5[10];
                  lVar12 = 0;
                  do {
                    pbVar7 = pbVar5 + lVar12 + ((ulong)(byte)bVar3 - (uVar6 - 1)) * 8 + 0xc;
                    *(undefined4 *)(pbVar8 + lVar12 + 0xc) = *(undefined4 *)pbVar7;
                    *(undefined4 *)(pbVar8 + lVar12 + 0x10) = *(undefined4 *)(pbVar7 + 4);
                    lVar12 = lVar12 + 8;
                  } while (pbVar7 + 8 != pbVar5 + ((byte)bVar3 - sVar17) * 8 + 0xc);
                }
LAB_001d153a:
                uVar9 = *(ulong *)pbVar5;
                if ((uVar9 & 7) == 0) {
                  bVar3 = pbVar5[8];
                  bVar16 = pbVar5[10];
                  *(undefined4 *)(uVar9 + 0xc + (ulong)(byte)bVar3 * 8) =
                       *(undefined4 *)(pbVar5 + ((byte)bVar16 - uVar6) * 8 + 0xc);
                  *(undefined4 *)(uVar9 + 0x10 + (ulong)(byte)bVar3 * 8) =
                       *(undefined4 *)(pbVar5 + ((byte)bVar16 - uVar6) * 8 + 0x10);
                  if (pbVar5[0xb] ==
                      (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                       )0x0) {
                    sVar17 = (size_type)(byte)pbVar8[10];
                    do {
                      pbVar7 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                               ::child(pbVar8,sVar17);
                      btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      ::init_child(pbVar8,(int)sVar17 + (uint)bVar11 + (uint)(bVar11 == 0),pbVar7);
                      btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      ::mutable_child(pbVar8,sVar17);
                      bVar18 = sVar17 != 0;
                      sVar17 = sVar17 - 1;
                    } while (bVar18);
                    iVar10 = 1 - uVar15;
                    i = 0;
                    do {
                      pbVar7 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                               ::child(pbVar5,(long)(int)((uint)(byte)pbVar5[10] + iVar10));
                      btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      ::init_child(pbVar8,i,pbVar7);
                      btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      ::mutable_child(pbVar5,(long)(int)((uint)(byte)pbVar5[10] + iVar10));
                      iVar10 = iVar10 + 1;
                      i = i + 1;
                    } while (iVar10 != 1);
                  }
                  pbVar5[10] = (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                )((char)pbVar5[10] - (char)bVar14);
                  pbVar8[10] = (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                )((char)pbVar8[10] + (char)bVar14);
                  pbVar7 = iter->node;
                  if (((ulong)pbVar7 & 7) == 0) {
                    if ((int)(uint)(byte)pbVar7[10] < iter->position) {
                      iter->position = iter->position + ~(uint)(byte)pbVar7[10];
                      iter->node = pbVar8;
                      pbVar7 = pbVar8;
                    }
                    bVar3 = (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                             )0x1e;
                    if (pbVar7[0xb] !=
                        (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                         )0x0) {
                      bVar3 = pbVar7[0xb];
                    }
                    if ((byte)pbVar7[10] < (byte)bVar3) {
                      return;
                    }
                    __assert_fail("node->count() < node->max_count()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                  ,0xb8b,
                                  "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                                 );
                  }
                  goto LAB_001d164d;
                }
              }
            }
            else {
              btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::uninitialized_move_n
                        (pbVar8,uVar6,(long)(int)((byte)bVar3 - uVar15),(ulong)(byte)bVar3,pbVar8,
                         in_R9);
              bVar3 = pbVar8[10];
              if ((byte)bVar14 < (byte)bVar3) {
                uVar4 = ~uVar15 + (uint)(byte)bVar3;
                if (-1 < (int)uVar4) {
                  uVar9 = (ulong)uVar4 * 8 + 0x14;
                  pbVar7 = pbVar8 + (ulong)(uint)(byte)bVar3 * 8 + 8;
                  do {
                    *(undefined4 *)(pbVar7 + -4) = *(undefined4 *)(pbVar8 + (uVar9 - 8));
                    *(undefined4 *)pbVar7 = *(undefined4 *)(pbVar8 + (uVar9 - 4));
                    uVar9 = uVar9 - 8;
                    pbVar7 = pbVar7 + -8;
                  } while (0x13 < uVar9);
                }
              }
              uVar9 = *(ulong *)pbVar5;
              if ((uVar9 & 7) == 0) {
                bVar3 = pbVar5[8];
                *(undefined4 *)(pbVar8 + uVar6 * 8 + 4) =
                     *(undefined4 *)(uVar9 + 0xc + (ulong)(byte)bVar3 * 8);
                *(undefined4 *)(pbVar8 + uVar6 * 8 + 8) =
                     *(undefined4 *)(uVar9 + 0x10 + (ulong)(byte)bVar3 * 8);
                if (uVar6 - 1 != 0) {
                  bVar3 = pbVar5[10];
                  lVar12 = 0;
                  do {
                    pbVar7 = pbVar5 + lVar12 + ((ulong)(byte)bVar3 - (uVar6 - 1)) * 8 + 0xc;
                    *(undefined4 *)(pbVar8 + lVar12 + 0xc) = *(undefined4 *)pbVar7;
                    *(undefined4 *)(pbVar8 + lVar12 + 0x10) = *(undefined4 *)(pbVar7 + 4);
                    lVar12 = lVar12 + 8;
                  } while (pbVar7 + 8 != pbVar5 + (ulong)(byte)bVar3 * 8 + 0xc);
                }
                goto LAB_001d153a;
              }
            }
LAB_001d16fa:
            __function = 
            "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
            ;
            goto LAB_001d1662;
          }
        }
      }
      if ((pbVar7[0xb] !=
           (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            )0x0) &&
         (pbVar7[0xb] !=
          (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           )0x1e)) {
        __assert_fail("parent->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb93,
                      "void phmap::priv::btree<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      if (pbVar7[10] ==
          (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           )0x1e) {
        pbVar8 = iter->node;
        if (((ulong)pbVar8 & 7) != 0) goto LAB_001d16e0;
        alloc = *(allocator_type **)pbVar8;
        local_40.position = (int)(byte)pbVar8[8];
        local_40.node =
             (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              *)alloc;
        rebalance_or_split(this,&local_40);
      }
LAB_001d12e3:
      if (((ulong)iter->node & 7) == 0) {
        if (iter->node[0xb] ==
            (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
             )0x0) {
          pbVar8 = new_internal_node(this,pbVar7);
          btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::split(iter->node,iter->position,pbVar8,alloc);
        }
        else {
          pbVar8 = (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    *)Allocate<8ul,std::allocator<std::pair<int_const,int>>>
                                ((allocator<std::pair<const_int,_int>_> *)this,0x100);
          if (((ulong)pbVar8 & 7) != 0) {
            __function = 
            "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = char]"
            ;
            goto LAB_001d1662;
          }
          *(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            **)pbVar8 = pbVar7;
          *(undefined4 *)(pbVar8 + 8) = 0x1e000000;
          btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::split(iter->node,iter->position,pbVar8,alloc);
          if (this->rightmost_ == iter->node) {
            this->rightmost_ = pbVar8;
          }
        }
        if (((ulong)iter->node & 7) == 0) {
          bVar3 = iter->node[10];
          if ((int)(uint)(byte)bVar3 < iter->position) {
            iter->position = iter->position + ~(uint)(byte)bVar3;
            iter->node = pbVar8;
          }
          return;
        }
      }
    }
LAB_001d164d:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
    ;
  }
LAB_001d1662:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
        node_type *&node = iter->node;
        int &insert_position = iter->position;
        assert(node->count() == node->max_count());
        assert(kNodeValues == node->max_count());

        // First try to make room on the node by rebalancing.
        node_type *parent = node->parent();
        if (node != root()) {
            if (node->position() > 0) {
                // Try rebalancing with our left sibling.
                node_type *left = parent->child(node->position() - 1);
                assert(left->max_count() == kNodeValues);
                if (left->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the end of the right node then we bias rebalancing to
                    // fill up the left node.
                    int to_move = (kNodeValues - left->count()) /
                        (1 + (insert_position < kNodeValues));
                    to_move = (std::max)(1, to_move);

                    if (((insert_position - to_move) >= 0) ||
                        ((left->count() + to_move) < kNodeValues)) {
                        left->rebalance_right_to_left(to_move, node, mutable_allocator());

                        assert(node->max_count() - node->count() == to_move);
                        insert_position = insert_position - to_move;
                        if (insert_position < 0) {
                            insert_position = insert_position + left->count() + 1;
                            node = left;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            if (node->position() < parent->count()) {
                // Try rebalancing with our right sibling.
                node_type *right = parent->child(node->position() + 1);
                assert(right->max_count() == kNodeValues);
                if (right->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the _beginning of the left node then we bias rebalancing
                    // to fill up the right node.
                    int to_move =
                        (kNodeValues - right->count()) / (1 + (insert_position > 0));
                    to_move = (std::max)(1, to_move);

                    if ((insert_position <= (node->count() - to_move)) ||
                        ((right->count() + to_move) < kNodeValues)) {
                        node->rebalance_left_to_right(to_move, right, mutable_allocator());

                        if (insert_position > node->count()) {
                            insert_position = insert_position - node->count() - 1;
                            node = right;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            // Rebalancing failed, make sure there is room on the parent node for a new
            // value.
            assert(parent->max_count() == kNodeValues);
            if (parent->count() == kNodeValues) {
                iterator parent_iter(node->parent(), node->position());
                rebalance_or_split(&parent_iter);
            }
        } else {
            // Rebalancing not possible because this is the root node.
            // Create a new root node and set the current root node as the child of the
            // new root.
            parent = new_internal_node(parent);
            parent->init_child(0, root());
            mutable_root() = parent;
            // If the former root was a leaf node, then it's now the rightmost node.
            assert(!parent->child(0)->leaf() || parent->child(0) == rightmost_);
        }

        // Split the node.
        node_type *split_node;
        if (node->leaf()) {
            split_node = new_leaf_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
            if (rightmost_ == node) rightmost_ = split_node;
        } else {
            split_node = new_internal_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
        }

        if (insert_position > node->count()) {
            insert_position = insert_position - node->count() - 1;
            node = split_node;
        }
    }